

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void transaction_simple_api_test(void)

{
  void *pvVar1;
  fdb_doc *doc;
  fdb_status fVar2;
  int iVar3;
  fdb_kvs_handle *pfVar4;
  size_t sVar5;
  size_t sVar6;
  fdb_kvs_handle *pfVar7;
  fdb_kvs_handle *pfVar8;
  ulong uVar9;
  uint uVar10;
  fdb_custom_cmp_variable *unaff_RBP;
  char *pcVar11;
  undefined1 *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  fdb_kvs_config *config;
  char *ptr;
  void *value;
  size_t valuelen;
  fdb_kvs_handle *db;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_5f8;
  fdb_doc *pfStack_5f0;
  fdb_kvs_handle *pfStack_5e8;
  timeval tStack_5e0;
  char acStack_5d0 [256];
  char acStack_4d0 [264];
  fdb_kvs_handle *pfStack_3c8;
  undefined1 *puStack_3c0;
  fdb_kvs_handle *pfStack_3b8;
  fdb_kvs_config *pfStack_3b0;
  fdb_kvs_handle *pfStack_3a8;
  fdb_custom_cmp_variable *pp_Stack_3a0;
  fdb_kvs_handle *local_390;
  fdb_custom_cmp_variable local_388;
  fdb_kvs_handle *local_380;
  fdb_kvs_handle *local_378;
  fdb_kvs_handle *local_370;
  fdb_file_handle *local_368;
  hbtrie *local_360;
  btree *local_358;
  fdb_kvs_config local_350;
  timeval local_338;
  undefined1 local_328 [512];
  fdb_config local_128;
  
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x117fdf;
  gettimeofday(&local_338,(__timezone_ptr_t)0x0);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x117fe4;
  memleak_start();
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x117ff0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118000;
  fdb_get_default_config();
  config = &local_350;
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11800d;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.purging_interval = 0;
  local_128.compaction_threshold = '\0';
  pfVar4 = (fdb_kvs_handle *)&local_358;
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118046;
  fdb_open((fdb_file_handle **)pfVar4,"./mvcc_test1",&local_128);
  pfVar7 = (fdb_kvs_handle *)&local_380;
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118059;
  fdb_kvs_open_default((fdb_file_handle *)local_358,(fdb_kvs_handle **)pfVar7,config);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11806f;
  pfVar8 = local_380;
  fVar2 = fdb_set_log_callback(local_380,logCallbackFunc,"transaction_simple_api_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011865a;
  pcVar11 = local_328 + 0x100;
  ptr = "body%d";
  unaff_RBP = (fdb_custom_cmp_variable *)0x0;
  do {
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1180a0;
    sprintf(pcVar11,"key%d",unaff_RBP);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1180af;
    sprintf(local_328,"body%d",unaff_RBP);
    unaff_R13 = local_380;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1180bc;
    pfVar4 = (fdb_kvs_handle *)strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1180c7;
    sVar5 = strlen(local_328);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1180db;
    fVar2 = fdb_set_kv(unaff_R13,pcVar11,(size_t)pfVar4,local_328,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1185e9;
      transaction_simple_api_test();
      goto LAB_001185e9;
    }
    uVar10 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_custom_cmp_variable *)(ulong)uVar10;
  } while (uVar10 != 10);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1180f6;
  fdb_commit((fdb_file_handle *)local_358,'\0');
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118118;
  fdb_open((fdb_file_handle **)&local_360,"./mvcc_test1",&local_128);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11812b;
  fdb_open(&local_368,"./mvcc_test1",&local_128);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118140;
  fdb_kvs_open_default((fdb_file_handle *)local_360,&local_370,&local_350);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118151;
  fdb_kvs_open_default(local_368,&local_378,&local_350);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11815e;
  fdb_begin_transaction((fdb_file_handle *)local_360,'\x02');
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11816c;
  fdb_begin_transaction(local_368,'\x02');
  pcVar11 = local_328 + 0x100;
  uVar10 = 0;
  do {
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118191;
    sprintf(pcVar11,"key%d",(ulong)uVar10);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1181a4;
    sprintf(local_328,"body%d_txn1",(ulong)uVar10);
    pfVar4 = local_370;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1181b1;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1181bc;
    sVar6 = strlen(local_328);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1181d0;
    fdb_set_kv(pfVar4,pcVar11,sVar5,local_328,sVar6);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1181df;
    sprintf(pcVar11,"key%d",(ulong)uVar10);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1181f2;
    sprintf(local_328,"body%d_txn2",(ulong)uVar10);
    pfVar4 = local_378;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1181ff;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11820a;
    sVar6 = strlen(local_328);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11821e;
    fdb_set_kv(pfVar4,pcVar11,sVar5,local_328,sVar6);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 10);
  pcVar11 = local_328 + 0x100;
  unaff_R13 = (fdb_kvs_handle *)&local_390;
  unaff_RBP = &local_388;
  ptr = (char *)0x0;
  do {
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118257;
    sprintf(pcVar11,"key%d",ptr);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11826b;
    sprintf(local_328,"body%d",ptr);
    pfVar7 = local_380;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118278;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11828c;
    fVar2 = fdb_get_kv(pfVar7,pcVar11,sVar5,(void **)unaff_R13,(size_t *)unaff_RBP);
    pfVar4 = local_390;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001185f6;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1182a9;
    iVar3 = bcmp(local_390,local_328,(size_t)local_388);
    if (iVar3 != 0) goto LAB_001185e9;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1182b9;
    fdb_free_block(pfVar4);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1182cd;
    sprintf(pcVar11,"key%d",ptr);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1182e1;
    sprintf(local_328,"body%d_txn1",ptr);
    pfVar4 = local_370;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1182ee;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118302;
    fVar2 = fdb_get_kv(pfVar4,pcVar11,sVar5,(void **)unaff_R13,(size_t *)unaff_RBP);
    pfVar7 = local_390;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118608;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11831f;
    iVar3 = bcmp(local_390,local_328,(size_t)local_388);
    if (iVar3 != 0) goto LAB_001185fb;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11832f;
    fdb_free_block(pfVar7);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118343;
    sprintf(pcVar11,"key%d",ptr);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118357;
    sprintf(local_328,"body%d_txn2",ptr);
    pfVar8 = local_378;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118364;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118378;
    fVar2 = fdb_get_kv(pfVar8,pcVar11,sVar5,(void **)unaff_R13,(size_t *)unaff_RBP);
    pfVar4 = local_390;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011861a;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118395;
    iVar3 = bcmp(local_390,local_328,(size_t)local_388);
    if (iVar3 != 0) goto LAB_0011860d;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1183a5;
    fdb_free_block(pfVar4);
    uVar10 = (int)ptr + 1;
    ptr = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1183be;
  fdb_end_transaction((fdb_file_handle *)local_360,'\0');
  pcVar11 = local_328 + 0x100;
  unaff_R13 = (fdb_kvs_handle *)&local_390;
  unaff_RBP = &local_388;
  ptr = (char *)0x0;
  do {
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1183ec;
    sprintf(pcVar11,"key%d",ptr);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118400;
    sprintf(local_328,"body%d_txn1",ptr);
    pfVar4 = local_380;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11840d;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118421;
    fVar2 = fdb_get_kv(pfVar4,pcVar11,sVar5,(void **)unaff_R13,(size_t *)unaff_RBP);
    pfVar8 = local_390;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011862c;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11843e;
    iVar3 = bcmp(local_390,local_328,(size_t)local_388);
    if (iVar3 != 0) goto LAB_0011861f;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11844e;
    fVar2 = fdb_free_block(pfVar8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118631;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11846a;
    sprintf(pcVar11,"key%d",ptr);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11847e;
    sprintf(local_328,"body%d_txn2",ptr);
    pfVar8 = local_378;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11848b;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11849f;
    fVar2 = fdb_get_kv(pfVar8,pcVar11,sVar5,(void **)unaff_R13,(size_t *)unaff_RBP);
    pfVar7 = local_390;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118636;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1184bc;
    iVar3 = bcmp(local_390,local_328,(size_t)local_388);
    if (iVar3 != 0) goto LAB_0011863b;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1184cc;
    fdb_free_block(pfVar7);
    uVar10 = (int)ptr + 1;
    ptr = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1184e5;
  fdb_end_transaction(local_368,'\0');
  pcVar11 = local_328 + 0x100;
  unaff_R13 = (fdb_kvs_handle *)&local_390;
  unaff_RBP = &local_388;
  pfVar7 = (fdb_kvs_handle *)0x0;
  while( true ) {
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118511;
    sprintf(pcVar11,"key%d",pfVar7);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118524;
    sprintf(local_328,"body%d_txn2",pfVar7);
    pfVar4 = local_380;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118531;
    sVar5 = strlen(pcVar11);
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118545;
    pfVar8 = pfVar4;
    fVar2 = fdb_get_kv(pfVar4,pcVar11,sVar5,(void **)unaff_R13,(size_t *)unaff_RBP);
    ptr = (char *)local_390;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118562;
    iVar3 = bcmp(local_390,local_328,(size_t)local_388);
    if (iVar3 != 0) goto LAB_00118648;
    pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118572;
    fdb_free_block(ptr);
    uVar10 = (int)pfVar7 + 1;
    pfVar7 = (fdb_kvs_handle *)(ulong)uVar10;
    if (uVar10 == 10) {
      pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118583;
      fdb_close((fdb_file_handle *)local_358);
      pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11858d;
      fdb_close((fdb_file_handle *)local_360);
      pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118597;
      fdb_close(local_368);
      pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11859c;
      fdb_shutdown();
      pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1185a1;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (transaction_simple_api_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1185d2;
      fprintf(_stderr,pcVar11,"transaction simple API test");
      return;
    }
  }
  goto LAB_00118655;
LAB_001185e9:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1185f6;
  transaction_simple_api_test();
  pfVar7 = pfVar4;
LAB_001185f6:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x1185fb;
  transaction_simple_api_test();
LAB_001185fb:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118608;
  transaction_simple_api_test();
  pfVar4 = pfVar7;
LAB_00118608:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11860d;
  transaction_simple_api_test();
LAB_0011860d:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11861a;
  transaction_simple_api_test();
  pfVar8 = pfVar4;
LAB_0011861a:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11861f;
  transaction_simple_api_test();
LAB_0011861f:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11862c;
  transaction_simple_api_test();
  pfVar4 = pfVar8;
LAB_0011862c:
  pfVar8 = pfVar4;
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118631;
  transaction_simple_api_test();
LAB_00118631:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118636;
  transaction_simple_api_test();
LAB_00118636:
  pfVar7 = pfVar8;
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11863b;
  transaction_simple_api_test();
LAB_0011863b:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118648;
  transaction_simple_api_test();
LAB_00118648:
  pfVar8 = (fdb_kvs_handle *)local_328;
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x118655;
  transaction_simple_api_test();
  pfVar4 = (fdb_kvs_handle *)ptr;
LAB_00118655:
  config = (fdb_kvs_config *)(local_328 + 0x100);
  unaff_R12 = local_328;
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)0x11865a;
  transaction_simple_api_test();
LAB_0011865a:
  pp_Stack_3a0 = (fdb_custom_cmp_variable *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_3c8 = pfVar7;
  puStack_3c0 = unaff_R12;
  pfStack_3b8 = unaff_R13;
  pfStack_3b0 = config;
  pfStack_3a8 = pfVar4;
  pp_Stack_3a0 = unaff_RBP;
  gettimeofday(&tStack_5e0,(__timezone_ptr_t)0x0);
  fVar2 = fdb_snapshot_open(pfVar8,&pfStack_5e8,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_init(pfStack_5e8,&pfStack_5f8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar9 = 0;
  do {
    uVar10 = (uint)uVar9;
    pfStack_5f0 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_get(pfStack_5f8,&pfStack_5f0);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_4d0,"key%d",uVar9);
    sprintf(acStack_5d0,"body%d",uVar9);
    doc = pfStack_5f0;
    pvVar1 = pfStack_5f0->key;
    iVar3 = bcmp(pvVar1,acStack_4d0,pfStack_5f0->keylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_4d0,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = doc->body;
    iVar3 = bcmp(pvVar1,acStack_5d0,doc->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_5d0,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar10 = uVar10 + 1;
    uVar9 = (ulong)uVar10;
    fdb_doc_free(doc);
    fVar2 = fdb_iterator_next(pfStack_5f8);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  if (uVar10 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_close(pfStack_5f8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_close(pfStack_5e8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xdcc);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xdcc,"void *in_memory_snapshot_thread(void *)");
}

Assistant:

void transaction_simple_api_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2;
    fdb_kvs_handle *db, *db_txn1, *db_txn2;
    fdb_status status;

    char keybuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_simple_api_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db and begin transactions
    fdb_open(&dbfile_txn1, "./mvcc_test1", &fconfig);
    fdb_open(&dbfile_txn2, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_set_kv(db_txn1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));

        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        fdb_set_kv(db_txn2, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
    }

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);

        // txn1
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        status = fdb_get_kv(db_txn1, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);

        // txn2
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db_txn2, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // commit txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        status = fdb_free_block(value);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // txn2
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db_txn2, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // commit txn2
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn2", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value, bodybuf, valuelen);
        fdb_free_block(value);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction simple API test");
}